

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint8_avx2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_false>_>,_false>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  bool bVar15;
  uint uVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  ulong *puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined4 in_register_0000149c;
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined4 in_register_000015dc;
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  vint8 bi_1;
  vfloat<4> fmin;
  vint<8> octant;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCIntersectFunctionNArguments local_1350;
  Geometry *local_1320;
  undefined8 local_1318;
  RTCIntersectArguments *local_1310;
  AccelData *local_1308;
  ulong local_1300;
  RayHitK<8> *local_12f8;
  RayQueryContext *local_12f0;
  long local_12e8;
  long local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  uint local_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  undefined4 local_1240;
  undefined4 uStack_123c;
  undefined4 uStack_1238;
  undefined4 uStack_1234;
  uint local_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  uint local_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  uint local_11d0;
  uint uStack_11cc;
  uint uStack_11c8;
  uint uStack_11c4;
  undefined1 local_11c0 [16];
  uint local_11b0;
  uint uStack_11ac;
  uint uStack_11a8;
  uint uStack_11a4;
  undefined1 local_11a0 [16];
  uint local_1190;
  uint uStack_118c;
  uint uStack_1188;
  uint uStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  undefined4 local_1170;
  undefined4 uStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  float local_1120;
  float fStack_111c;
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined4 local_10e0;
  undefined4 uStack_10dc;
  undefined4 uStack_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  ulong local_fa0;
  undefined4 local_f98 [2];
  ulong local_f90 [492];
  undefined1 auVar32 [64];
  undefined1 auVar56 [64];
  
  auVar36 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
  auVar29 = vpcmpeqd_avx2(auVar36,(undefined1  [32])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar29);
  if (uVar16 == 0) {
    return;
  }
  local_1308 = This->ptr;
  local_1300 = (ulong)(uVar16 & 0xff);
  auVar4 = *(undefined1 (*) [32])(ray + 0x80);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar38._16_4_ = 0x7fffffff;
  auVar38._20_4_ = 0x7fffffff;
  auVar38._24_4_ = 0x7fffffff;
  auVar38._28_4_ = 0x7fffffff;
  auVar39 = vandps_avx(auVar4,auVar38);
  auVar45._8_4_ = 0x219392ef;
  auVar45._0_8_ = 0x219392ef219392ef;
  auVar45._12_4_ = 0x219392ef;
  auVar45._16_4_ = 0x219392ef;
  auVar45._20_4_ = 0x219392ef;
  auVar45._24_4_ = 0x219392ef;
  auVar45._28_4_ = 0x219392ef;
  auVar39 = vcmpps_avx(auVar39,auVar45,1);
  auVar42 = vblendvps_avx(auVar4,auVar45,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar38);
  auVar39 = vcmpps_avx(auVar39,auVar45,1);
  auVar47 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar45,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar38);
  auVar39 = vcmpps_avx(auVar39,auVar45,1);
  auVar39 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar45,auVar39);
  auVar38 = vrcpps_avx(auVar42);
  auVar46._8_4_ = 0x3f800000;
  auVar46._0_8_ = &DAT_3f8000003f800000;
  auVar46._12_4_ = 0x3f800000;
  auVar46._16_4_ = 0x3f800000;
  auVar46._20_4_ = 0x3f800000;
  auVar46._24_4_ = 0x3f800000;
  auVar46._28_4_ = 0x3f800000;
  auVar8 = vfnmadd213ps_fma(auVar42,auVar38,auVar46);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar38,auVar38);
  auVar52 = ZEXT1664(auVar8);
  auVar42 = vrcpps_avx(auVar47);
  auVar9 = vfnmadd213ps_fma(auVar47,auVar42,auVar46);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar42,auVar42);
  auVar53 = ZEXT1664(auVar9);
  auVar42 = vrcpps_avx(auVar39);
  auVar41 = vfnmadd213ps_fma(auVar39,auVar42,auVar46);
  auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar42,auVar42);
  auVar54 = ZEXT1664(auVar41);
  auVar55 = ZEXT816(0) << 0x40;
  auVar56 = ZEXT1664(auVar55);
  local_10a0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar55));
  local_10c0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar55));
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar39._16_4_ = 1;
  auVar39._20_4_ = 1;
  auVar39._24_4_ = 1;
  auVar39._28_4_ = 1;
  auVar42 = ZEXT1632(auVar55);
  auVar4 = vcmpps_avx(auVar4,auVar42,1);
  auVar4 = vandps_avx(auVar4,auVar39);
  auVar39 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar42,1);
  auVar47._8_4_ = 2;
  auVar47._0_8_ = 0x200000002;
  auVar47._12_4_ = 2;
  auVar47._16_4_ = 2;
  auVar47._20_4_ = 2;
  auVar47._24_4_ = 2;
  auVar47._28_4_ = 2;
  auVar39 = vandps_avx(auVar39,auVar47);
  auVar39 = vorps_avx(auVar39,auVar4);
  auVar4 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar42,1);
  auVar42._8_4_ = 4;
  auVar42._0_8_ = 0x400000004;
  auVar42._12_4_ = 4;
  auVar42._16_4_ = 4;
  auVar42._20_4_ = 4;
  auVar42._24_4_ = 4;
  auVar42._28_4_ = 4;
  auVar4 = vandps_avx(auVar4,auVar42);
  auVar36 = vpor_avx2(auVar29 ^ auVar36,auVar4);
  local_1100 = vpor_avx2(auVar36,auVar39);
  local_1040 = *(float *)ray;
  fStack_103c = *(float *)(ray + 4);
  fStack_1038 = *(float *)(ray + 8);
  fStack_1034 = *(float *)(ray + 0xc);
  fStack_1030 = *(float *)(ray + 0x10);
  fStack_102c = *(float *)(ray + 0x14);
  fStack_1028 = *(float *)(ray + 0x18);
  uStack_1024 = *(undefined4 *)(ray + 0x1c);
  local_1060 = *(float *)(ray + 0x20);
  fStack_105c = *(float *)(ray + 0x24);
  fStack_1058 = *(float *)(ray + 0x28);
  fStack_1054 = *(float *)(ray + 0x2c);
  fStack_1050 = *(float *)(ray + 0x30);
  fStack_104c = *(float *)(ray + 0x34);
  fStack_1048 = *(float *)(ray + 0x38);
  uStack_1044 = *(undefined4 *)(ray + 0x3c);
  local_1080 = *(float *)(ray + 0x40);
  fStack_107c = *(float *)(ray + 0x44);
  fStack_1078 = *(float *)(ray + 0x48);
  fStack_1074 = *(float *)(ray + 0x4c);
  fStack_1070 = *(float *)(ray + 0x50);
  fStack_106c = *(float *)(ray + 0x54);
  fStack_1068 = *(float *)(ray + 0x58);
  uStack_1064 = *(undefined4 *)(ray + 0x5c);
  local_1250 = 0x80000000;
  uStack_124c = 0x80000000;
  uStack_1248 = 0x80000000;
  uStack_1244 = 0x80000000;
  local_10e0 = 0x7f800000;
  uStack_10dc = 0x7f800000;
  uStack_10d8 = 0x7f800000;
  uStack_10d4 = 0x7f800000;
  uStack_10d0 = 0x7f800000;
  uStack_10cc = 0x7f800000;
  uStack_10c8 = 0x7f800000;
  uStack_10c4 = 0x7f800000;
  local_fe0 = ZEXT1632(auVar8);
  local_1000 = ZEXT1632(auVar9);
  local_1020 = ZEXT1632(auVar41);
  local_1120 = auVar8._0_4_ * -*(float *)ray;
  fStack_111c = auVar8._4_4_ * -*(float *)(ray + 4);
  fStack_1118 = auVar8._8_4_ * -*(float *)(ray + 8);
  fStack_1114 = auVar8._12_4_ * -*(float *)(ray + 0xc);
  fStack_1110 = -*(float *)(ray + 0x10) * 0.0;
  fStack_110c = -*(float *)(ray + 0x14) * 0.0;
  fStack_1108 = -*(float *)(ray + 0x18) * 0.0;
  local_1140 = auVar9._0_4_ * -*(float *)(ray + 0x20);
  fStack_113c = auVar9._4_4_ * -*(float *)(ray + 0x24);
  fStack_1138 = auVar9._8_4_ * -*(float *)(ray + 0x28);
  fStack_1134 = auVar9._12_4_ * -*(float *)(ray + 0x2c);
  fStack_1130 = -*(float *)(ray + 0x30) * 0.0;
  fStack_112c = -*(float *)(ray + 0x34) * 0.0;
  fStack_1128 = -*(float *)(ray + 0x38) * 0.0;
  local_1160 = auVar41._0_4_ * -*(float *)(ray + 0x40);
  fStack_115c = auVar41._4_4_ * -*(float *)(ray + 0x44);
  fStack_1158 = auVar41._8_4_ * -*(float *)(ray + 0x48);
  fStack_1154 = auVar41._12_4_ * -*(float *)(ray + 0x4c);
  fStack_1150 = -*(float *)(ray + 0x50) * 0.0;
  fStack_114c = -*(float *)(ray + 0x54) * 0.0;
  fStack_1148 = -*(float *)(ray + 0x58) * 0.0;
  uStack_1144 = *(undefined4 *)(ray + 0x5c);
  local_12f8 = ray;
  local_12f0 = context;
  uStack_1124 = in_register_000015dc;
  uStack_1104 = in_register_0000149c;
LAB_0060d7b2:
  lVar22 = 0;
  for (uVar25 = local_1300; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar17 = *(undefined4 *)(local_1100 + lVar22 * 4);
  auVar29._4_4_ = uVar17;
  auVar29._0_4_ = uVar17;
  auVar29._8_4_ = uVar17;
  auVar29._12_4_ = uVar17;
  auVar29._16_4_ = uVar17;
  auVar29._20_4_ = uVar17;
  auVar29._24_4_ = uVar17;
  auVar29._28_4_ = uVar17;
  auVar39 = vpcmpeqd_avx2(auVar29,local_1100);
  uVar17 = vmovmskps_avx(auVar39);
  local_1300 = ~CONCAT44((int)((ulong)lVar22 >> 0x20),uVar17) & local_1300;
  auVar43._8_4_ = 0x7f800000;
  auVar43._0_8_ = 0x7f8000007f800000;
  auVar43._12_4_ = 0x7f800000;
  auVar43._16_4_ = 0x7f800000;
  auVar43._20_4_ = 0x7f800000;
  auVar43._24_4_ = 0x7f800000;
  auVar43._28_4_ = 0x7f800000;
  auVar36 = vblendvps_avx(auVar43,auVar52._0_32_,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar8 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar43,auVar53._0_32_,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar36 = vblendvps_avx(auVar43,auVar54._0_32_,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar8 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar57._8_4_ = 0xff800000;
  auVar57._0_8_ = 0xff800000ff800000;
  auVar57._12_4_ = 0xff800000;
  auVar57._16_4_ = 0xff800000;
  auVar57._20_4_ = 0xff800000;
  auVar57._24_4_ = 0xff800000;
  auVar57._28_4_ = 0xff800000;
  auVar36 = vblendvps_avx(auVar57,auVar52._0_32_,auVar39);
  auVar37 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar29 = vmaxps_avx(auVar36,auVar29);
  auVar36 = vblendvps_avx(auVar57,auVar53._0_32_,auVar39);
  auVar8 = vmaxps_avx(auVar29._0_16_,auVar29._16_16_);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar9 = vunpcklps_avx(auVar8,auVar9);
  auVar36 = vblendvps_avx(auVar57,auVar54._0_32_,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar8 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar5 = vinsertps_avx(auVar9,auVar8,0x28);
  auVar55 = vcmpps_avx(auVar37,_DAT_01feba10,5);
  auVar8 = vblendvps_avx(auVar5,auVar37,auVar55);
  auVar9 = vmovshdup_avx(auVar8);
  local_12c8 = (ulong)(auVar9._0_4_ < 0.0) << 4 | 0x20;
  auVar9 = vshufpd_avx(auVar8,auVar8,1);
  uVar26 = (ulong)(auVar9._0_4_ < 0.0) << 4 | 0x40;
  local_12d0 = local_12c8 ^ 0x10;
  local_1180 = auVar8._0_4_;
  auVar14._4_4_ = fStack_103c;
  auVar14._0_4_ = local_1040;
  auVar14._8_4_ = fStack_1038;
  auVar14._12_4_ = fStack_1034;
  auVar14._16_4_ = fStack_1030;
  auVar14._20_4_ = fStack_102c;
  auVar14._24_4_ = fStack_1028;
  auVar14._28_4_ = uStack_1024;
  auVar36 = vblendvps_avx(auVar43,auVar14,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar13._4_4_ = fStack_105c;
  auVar13._0_4_ = local_1060;
  auVar13._8_4_ = fStack_1058;
  auVar13._12_4_ = fStack_1054;
  auVar13._16_4_ = fStack_1050;
  auVar13._20_4_ = fStack_104c;
  auVar13._24_4_ = fStack_1048;
  auVar13._28_4_ = uStack_1044;
  auVar36 = vblendvps_avx(auVar43,auVar13,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar41 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar41 = vunpcklps_avx(auVar9,auVar41);
  auVar4._4_4_ = fStack_107c;
  auVar4._0_4_ = local_1080;
  auVar4._8_4_ = fStack_1078;
  auVar4._12_4_ = fStack_1074;
  auVar4._16_4_ = fStack_1070;
  auVar4._20_4_ = fStack_106c;
  auVar4._24_4_ = fStack_1068;
  auVar4._28_4_ = uStack_1064;
  auVar36 = vblendvps_avx(auVar43,auVar4,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar29);
  auVar9 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar41 = vinsertps_avx(auVar41,auVar9,0x28);
  auVar36 = vblendvps_avx(auVar57,auVar14,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar57,auVar13,auVar39);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar6 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar36 = vblendvps_avx(auVar57,auVar4,auVar39);
  auVar6 = vunpcklps_avx(auVar9,auVar6);
  auVar29 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vmaxps_avx(auVar36,auVar29);
  auVar9 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar6 = vinsertps_avx(auVar6,auVar9,0x28);
  auVar9 = vblendvps_avx(auVar6,auVar41,auVar55);
  auVar41 = vblendvps_avx(auVar41,auVar6,auVar55);
  local_12c0 = vblendvps_avx(auVar57,local_10c0,auVar39);
  auVar36 = vshufps_avx(local_12c0,local_12c0,0xb1);
  auVar36 = vmaxps_avx(local_12c0,auVar36);
  auVar29 = vshufpd_avx(auVar36,auVar36,5);
  auVar29 = vmaxps_avx(auVar36,auVar29);
  auVar36 = vblendvps_avx(auVar43,local_10a0,auVar39);
  auVar4 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar36 = vminps_avx(auVar36,auVar4);
  auVar4 = vshufpd_avx(auVar36,auVar36,5);
  auVar36 = vminps_avx(auVar36,auVar4);
  auVar7 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
  auVar51 = ZEXT3264(CONCAT428(uStack_1104,
                               CONCAT424(fStack_1108,
                                         CONCAT420(fStack_110c,
                                                   CONCAT416(fStack_1110,
                                                             CONCAT412(fStack_1114,
                                                                       CONCAT48(fStack_1118,
                                                                                CONCAT44(fStack_111c
                                                                                         ,local_1120
                                                                                        ))))))));
  auVar6 = vmaxss_avx(auVar29._0_16_,auVar29._16_16_);
  auVar50 = ZEXT3264(CONCAT428(uStack_1144,
                               CONCAT424(fStack_1148,
                                         CONCAT420(fStack_114c,
                                                   CONCAT416(fStack_1150,
                                                             CONCAT412(fStack_1154,
                                                                       CONCAT48(fStack_1158,
                                                                                CONCAT44(fStack_115c
                                                                                         ,local_1160
                                                                                        ))))))));
  auVar55 = vblendvps_avx(auVar37,auVar5,auVar55);
  auVar37._0_4_ = auVar41._0_4_ * local_1180;
  auVar37._4_4_ = auVar41._4_4_ * auVar8._4_4_;
  auVar37._8_4_ = auVar41._8_4_ * auVar8._8_4_;
  auVar37._12_4_ = auVar41._12_4_ * auVar8._12_4_;
  local_11e0 = auVar55._0_4_;
  auVar41._0_4_ = auVar9._0_4_ * local_11e0;
  auVar41._4_4_ = auVar9._4_4_ * auVar55._4_4_;
  auVar41._8_4_ = auVar9._8_4_ * auVar55._8_4_;
  auVar41._12_4_ = auVar9._12_4_ * auVar55._12_4_;
  local_12d8 = (ulong)(local_1180 < 0.0) << 4;
  uVar25 = local_12d8 ^ 0x10;
  local_fa0 = *(ulong *)&local_1308[1].bounds.bounds0.lower.field_0;
  local_f98[0] = 0;
  fStack_117c = local_1180;
  fStack_1178 = local_1180;
  fStack_1174 = local_1180;
  local_1190 = local_1250 ^ (uint)auVar37._0_4_;
  uStack_118c = uStack_124c ^ (uint)auVar37._0_4_;
  uStack_1188 = uStack_1248 ^ (uint)auVar37._0_4_;
  uStack_1184 = uStack_1244 ^ (uint)auVar37._0_4_;
  local_11a0 = vshufps_avx(auVar8,auVar8,0x55);
  auVar9 = vshufps_avx(auVar37,auVar37,0x55);
  local_11b0 = local_1250 ^ auVar9._0_4_;
  uStack_11ac = uStack_124c ^ auVar9._4_4_;
  uStack_11a8 = uStack_1248 ^ auVar9._8_4_;
  uStack_11a4 = uStack_1244 ^ auVar9._12_4_;
  local_11c0 = vshufps_avx(auVar8,auVar8,0xaa);
  auVar8 = vshufps_avx(auVar37,auVar37,0xaa);
  local_11d0 = local_1250 ^ auVar8._0_4_;
  uStack_11cc = uStack_124c ^ auVar8._4_4_;
  uStack_11c8 = uStack_1248 ^ auVar8._8_4_;
  uStack_11c4 = uStack_1244 ^ auVar8._12_4_;
  fStack_11dc = local_11e0;
  fStack_11d8 = local_11e0;
  fStack_11d4 = local_11e0;
  local_11f0 = local_1250 ^ (uint)auVar41._0_4_;
  uStack_11ec = uStack_124c ^ (uint)auVar41._0_4_;
  uStack_11e8 = uStack_1248 ^ (uint)auVar41._0_4_;
  uStack_11e4 = uStack_1244 ^ (uint)auVar41._0_4_;
  local_1200 = vshufps_avx(auVar55,auVar55,0x55);
  auVar8 = vshufps_avx(auVar41,auVar41,0x55);
  local_1210._0_4_ = local_1250 ^ auVar8._0_4_;
  local_1210._4_4_ = uStack_124c ^ auVar8._4_4_;
  local_1210._8_4_ = uStack_1248 ^ auVar8._8_4_;
  local_1210._12_4_ = uStack_1244 ^ auVar8._12_4_;
  local_1220 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar8 = vshufps_avx(auVar41,auVar41,0xaa);
  local_1230 = local_1250 ^ auVar8._0_4_;
  uStack_122c = uStack_124c ^ auVar8._4_4_;
  uStack_1228 = uStack_1248 ^ auVar8._8_4_;
  uStack_1224 = uStack_1244 ^ auVar8._12_4_;
  local_1240 = auVar7._0_4_;
  uStack_123c = local_1240;
  uStack_1238 = local_1240;
  uStack_1234 = local_1240;
  auVar36._4_4_ = uStack_10dc;
  auVar36._0_4_ = local_10e0;
  auVar36._8_4_ = uStack_10d8;
  auVar36._12_4_ = uStack_10d4;
  auVar36._16_4_ = uStack_10d0;
  auVar36._20_4_ = uStack_10cc;
  auVar36._24_4_ = uStack_10c8;
  auVar36._28_4_ = uStack_10c4;
  local_12a0 = vblendvps_avx(auVar36,local_10a0,auVar39);
  auVar58 = ZEXT3264(CONCAT428(uStack_1124,
                               CONCAT424(fStack_1128,
                                         CONCAT420(fStack_112c,
                                                   CONCAT416(fStack_1130,
                                                             CONCAT412(fStack_1134,
                                                                       CONCAT48(fStack_1138,
                                                                                CONCAT44(fStack_113c
                                                                                         ,local_1140
                                                                                        ))))))));
  puVar21 = local_f90;
  do {
    local_1170 = auVar6._0_4_;
    uStack_116c = local_1170;
    uStack_1168 = local_1170;
    uStack_1164 = local_1170;
LAB_0060dc0d:
    do {
      do {
        if (puVar21 == &local_fa0) {
          if (local_1300 == 0) {
            return;
          }
          goto LAB_0060d7b2;
        }
        uVar17 = (undefined4)puVar21[-1];
        auVar30._4_4_ = uVar17;
        auVar30._0_4_ = uVar17;
        auVar30._8_4_ = uVar17;
        auVar30._12_4_ = uVar17;
        auVar30._16_4_ = uVar17;
        auVar30._20_4_ = uVar17;
        auVar30._24_4_ = uVar17;
        auVar30._28_4_ = uVar17;
        auVar32 = ZEXT3264(auVar30);
        puVar21 = puVar21 + -2;
        auVar36 = vcmpps_avx(auVar30,local_12c0,1);
      } while ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                    (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  SUB321(auVar36 >> 0x7f,0) == '\0') &&
                 (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                SUB321(auVar36 >> 0xbf,0) == '\0') &&
               (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               -1 < auVar36[0x1f]);
      uVar27 = *puVar21;
      while ((uVar27 & 8) == 0) {
        auVar8._4_4_ = uStack_118c;
        auVar8._0_4_ = local_1190;
        auVar8._8_4_ = uStack_1188;
        auVar8._12_4_ = uStack_1184;
        auVar11._4_4_ = fStack_117c;
        auVar11._0_4_ = local_1180;
        auVar11._8_4_ = fStack_1178;
        auVar11._12_4_ = fStack_1174;
        auVar8 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_12d8),auVar8,auVar11);
        auVar10._4_4_ = uStack_11ac;
        auVar10._0_4_ = local_11b0;
        auVar10._8_4_ = uStack_11a8;
        auVar10._12_4_ = uStack_11a4;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_12c8),auVar10,
                                 local_11a0);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar7._4_4_ = uStack_11cc;
        auVar7._0_4_ = local_11d0;
        auVar7._8_4_ = uStack_11c8;
        auVar7._12_4_ = uStack_11c4;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar26),auVar7,local_11c0);
        auVar55._4_4_ = uStack_123c;
        auVar55._0_4_ = local_1240;
        auVar55._8_4_ = uStack_1238;
        auVar55._12_4_ = uStack_1234;
        auVar9 = vpmaxsd_avx(auVar9,auVar55);
        auVar8 = vpmaxsd_avx(auVar8,auVar9);
        auVar9._4_4_ = uStack_11ec;
        auVar9._0_4_ = local_11f0;
        auVar9._8_4_ = uStack_11e8;
        auVar9._12_4_ = uStack_11e4;
        auVar6._4_4_ = fStack_11dc;
        auVar6._0_4_ = local_11e0;
        auVar6._8_4_ = fStack_11d8;
        auVar6._12_4_ = fStack_11d4;
        auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar25),auVar9,auVar6);
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + local_12d0),local_1210,
                                  local_1200);
        auVar9 = vpminsd_avx(auVar9,auVar41);
        auVar5._4_4_ = uStack_122c;
        auVar5._0_4_ = local_1230;
        auVar5._8_4_ = uStack_1228;
        auVar5._12_4_ = uStack_1224;
        auVar41 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar27 + 0x20 + (uVar26 ^ 0x10)),auVar5,
                                  local_1220);
        auVar12._4_4_ = uStack_116c;
        auVar12._0_4_ = local_1170;
        auVar12._8_4_ = uStack_1168;
        auVar12._12_4_ = uStack_1164;
        auVar41 = vpminsd_avx(auVar41,auVar12);
        auVar9 = vpminsd_avx(auVar9,auVar41);
        local_1280._0_16_ = auVar8;
        auVar8 = vcmpps_avx(auVar8,auVar9,2);
        uVar16 = vmovmskps_avx(auVar8);
        if (uVar16 == 0) {
          bVar15 = false;
          uVar19 = uVar27;
        }
        else {
          uVar23 = (ulong)(uVar16 & 0xff);
          auVar32 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          uVar24 = 0;
          uVar18 = 8;
          do {
            lVar22 = 0;
            for (uVar19 = uVar23; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            uVar17 = *(undefined4 *)(uVar27 + 0x20 + lVar22 * 4);
            auVar33._4_4_ = uVar17;
            auVar33._0_4_ = uVar17;
            auVar33._8_4_ = uVar17;
            auVar33._12_4_ = uVar17;
            auVar33._16_4_ = uVar17;
            auVar33._20_4_ = uVar17;
            auVar33._24_4_ = uVar17;
            auVar33._28_4_ = uVar17;
            uVar17 = *(undefined4 *)(uVar27 + 0x40 + lVar22 * 4);
            auVar35._4_4_ = uVar17;
            auVar35._0_4_ = uVar17;
            auVar35._8_4_ = uVar17;
            auVar35._12_4_ = uVar17;
            auVar35._16_4_ = uVar17;
            auVar35._20_4_ = uVar17;
            auVar35._24_4_ = uVar17;
            auVar35._28_4_ = uVar17;
            auVar8 = vfmadd213ps_fma(auVar33,auVar52._0_32_,auVar51._0_32_);
            auVar9 = vfmadd213ps_fma(auVar35,auVar53._0_32_,auVar58._0_32_);
            uVar17 = *(undefined4 *)(uVar27 + 0x60 + lVar22 * 4);
            auVar40._4_4_ = uVar17;
            auVar40._0_4_ = uVar17;
            auVar40._8_4_ = uVar17;
            auVar40._12_4_ = uVar17;
            auVar40._16_4_ = uVar17;
            auVar40._20_4_ = uVar17;
            auVar40._24_4_ = uVar17;
            auVar40._28_4_ = uVar17;
            auVar41 = vfmadd213ps_fma(auVar40,auVar54._0_32_,auVar50._0_32_);
            uVar17 = *(undefined4 *)(uVar27 + 0x30 + lVar22 * 4);
            auVar44._4_4_ = uVar17;
            auVar44._0_4_ = uVar17;
            auVar44._8_4_ = uVar17;
            auVar44._12_4_ = uVar17;
            auVar44._16_4_ = uVar17;
            auVar44._20_4_ = uVar17;
            auVar44._24_4_ = uVar17;
            auVar44._28_4_ = uVar17;
            auVar55 = vfmadd213ps_fma(auVar44,auVar52._0_32_,auVar51._0_32_);
            uVar17 = *(undefined4 *)(uVar27 + 0x50 + lVar22 * 4);
            auVar48._4_4_ = uVar17;
            auVar48._0_4_ = uVar17;
            auVar48._8_4_ = uVar17;
            auVar48._12_4_ = uVar17;
            auVar48._16_4_ = uVar17;
            auVar48._20_4_ = uVar17;
            auVar48._24_4_ = uVar17;
            auVar48._28_4_ = uVar17;
            uVar17 = *(undefined4 *)(uVar27 + 0x70 + lVar22 * 4);
            auVar49._4_4_ = uVar17;
            auVar49._0_4_ = uVar17;
            auVar49._8_4_ = uVar17;
            auVar49._12_4_ = uVar17;
            auVar49._16_4_ = uVar17;
            auVar49._20_4_ = uVar17;
            auVar49._24_4_ = uVar17;
            auVar49._28_4_ = uVar17;
            auVar37 = vfmadd213ps_fma(auVar48,auVar53._0_32_,auVar58._0_32_);
            auVar5 = vfmadd213ps_fma(auVar49,auVar54._0_32_,auVar50._0_32_);
            auVar36 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar55));
            auVar29 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar37));
            auVar36 = vpmaxsd_avx2(auVar36,auVar29);
            auVar29 = vpminsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar5));
            auVar29 = vpmaxsd_avx2(auVar29,local_12a0);
            auVar36 = vpmaxsd_avx2(auVar36,auVar29);
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar55));
            auVar4 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar37));
            auVar4 = vpminsd_avx2(auVar29,auVar4);
            auVar29 = vpmaxsd_avx2(ZEXT1632(auVar41),ZEXT1632(auVar5));
            auVar29 = vpminsd_avx2(auVar29,local_12c0);
            auVar29 = vpminsd_avx2(auVar4,auVar29);
            auVar36 = vcmpps_avx(auVar36,auVar29,2);
            uVar19 = uVar18;
            if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar36 >> 0x7f,0) != '\0') ||
                  (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0xbf,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar36[0x1f] < '\0') {
              uVar17 = *(undefined4 *)(local_1280 + lVar22 * 4);
              auVar28._4_4_ = uVar17;
              auVar28._0_4_ = uVar17;
              auVar28._8_4_ = uVar17;
              auVar28._12_4_ = uVar17;
              auVar34._16_4_ = uVar17;
              auVar34._0_16_ = auVar28;
              auVar34._20_4_ = uVar17;
              auVar34._24_4_ = uVar17;
              auVar34._28_4_ = uVar17;
              uVar19 = *(ulong *)(uVar27 + lVar22 * 8);
              auVar36 = vcmpps_avx(auVar34,auVar32._0_32_,1);
              if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar36 >> 0x7f,0) == '\0') &&
                    (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar36 >> 0xbf,0) == '\0') &&
                  (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar36[0x1f]) {
                *puVar21 = uVar19;
                uVar19 = uVar18;
              }
              else {
                if (uVar18 == 8) {
                  auVar32 = ZEXT3264(auVar34);
                  goto LAB_0060de2f;
                }
                *puVar21 = uVar18;
                auVar28 = auVar32._0_16_;
                auVar32 = ZEXT3264(auVar34);
              }
              uVar24 = uVar24 + 1;
              *(int *)(puVar21 + 1) = auVar28._0_4_;
              puVar21 = puVar21 + 2;
            }
LAB_0060de2f:
            uVar23 = uVar23 - 1 & uVar23;
            uVar18 = uVar19;
          } while (uVar23 != 0);
          if (uVar19 == 8) {
            bVar15 = false;
          }
          else {
            bVar15 = true;
            if (1 < uVar24) {
              puVar1 = puVar21 + -4;
              puVar2 = puVar21 + -2;
              if ((uint)puVar21[-3] < (uint)puVar21[-1]) {
                uVar27 = *puVar1;
                uVar18 = puVar21[-3];
                *(int *)(puVar21 + -3) = (int)puVar21[-1];
                *puVar1 = *puVar2;
                *puVar2 = uVar27;
                local_1350.geometryUserPtr._0_4_ = (undefined4)uVar18;
                *(undefined4 *)(puVar21 + -1) = local_1350.geometryUserPtr._0_4_;
              }
              if (uVar24 != 2) {
                puVar3 = puVar21 + -6;
                if ((uint)puVar21[-5] < (uint)puVar21[-1]) {
                  uVar27 = *puVar3;
                  uVar18 = puVar21[-5];
                  *(int *)(puVar21 + -5) = (int)puVar21[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = uVar27;
                  local_1350.geometryUserPtr._0_4_ = (undefined4)uVar18;
                  *(undefined4 *)(puVar21 + -1) = local_1350.geometryUserPtr._0_4_;
                }
                if ((uint)puVar21[-5] < (uint)puVar21[-3]) {
                  uVar27 = *puVar3;
                  uVar18 = puVar21[-5];
                  *(int *)(puVar21 + -5) = (int)puVar21[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = uVar27;
                  local_1350.geometryUserPtr._0_4_ = (undefined4)uVar18;
                  *(undefined4 *)(puVar21 + -3) = local_1350.geometryUserPtr._0_4_;
                }
              }
            }
          }
        }
        uVar27 = uVar19;
        if (!bVar15) goto LAB_0060dc0d;
      }
      auVar36 = vcmpps_avx(local_12c0,auVar32._0_32_,6);
      auVar32 = ZEXT3264(auVar36);
      if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar36 >> 0x7f,0) == '\0') &&
            (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar36 >> 0xbf,0) == '\0') &&
          (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar36[0x1f])
      goto LAB_0060dc0d;
      lVar22 = (ulong)((uint)uVar27 & 0xf) - 8;
      if (lVar22 != 0) {
        local_12e0 = 0;
        local_fc0 = auVar36;
        local_12e8 = lVar22;
        do {
          local_1350.geomID = *(uint *)((uVar27 & 0xfffffffffffffff0) + local_12e0 * 8);
          local_1320 = (context->scene->geometries).items[local_1350.geomID].ptr;
          uVar16 = local_1320->mask;
          auVar31._4_4_ = uVar16;
          auVar31._0_4_ = uVar16;
          auVar31._8_4_ = uVar16;
          auVar31._12_4_ = uVar16;
          auVar31._16_4_ = uVar16;
          auVar31._20_4_ = uVar16;
          auVar31._24_4_ = uVar16;
          auVar31._28_4_ = uVar16;
          auVar36 = vpand_avx2(auVar31,*(undefined1 (*) [32])(ray + 0x120));
          auVar29 = vpcmpeqd_avx2(auVar56._0_32_,auVar36);
          auVar36 = auVar32._0_32_ & ~auVar29;
          if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0x7f,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0xbf,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar36[0x1f] < '\0') {
            local_1280 = vandnps_avx(auVar29,auVar32._0_32_);
            local_1350.primID = *(uint *)((uVar27 & 0xfffffffffffffff0) + 4 + local_12e0 * 8);
            local_1350.valid = (int *)local_1280;
            local_1350.geometryUserPtr = local_1320->userPtr;
            local_1350.context = context->user;
            local_1350.N = 8;
            local_1318 = 0;
            local_1310 = context->args;
            pp_Var20 = (_func_int **)local_1310->intersect;
            if (pp_Var20 == (_func_int **)0x0) {
              pp_Var20 = local_1320[1].super_RefCount._vptr_RefCount;
            }
            local_1350.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var20)(&local_1350);
            auVar52 = ZEXT3264(local_fe0);
            auVar53 = ZEXT3264(local_1000);
            auVar54 = ZEXT3264(local_1020);
            auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar51 = ZEXT3264(CONCAT428(uStack_1104,
                                         CONCAT424(fStack_1108,
                                                   CONCAT420(fStack_110c,
                                                             CONCAT416(fStack_1110,
                                                                       CONCAT412(fStack_1114,
                                                                                 CONCAT48(
                                                  fStack_1118,CONCAT44(fStack_111c,local_1120)))))))
                              );
            auVar58 = ZEXT3264(CONCAT428(uStack_1124,
                                         CONCAT424(fStack_1128,
                                                   CONCAT420(fStack_112c,
                                                             CONCAT416(fStack_1130,
                                                                       CONCAT412(fStack_1134,
                                                                                 CONCAT48(
                                                  fStack_1138,CONCAT44(fStack_113c,local_1140)))))))
                              );
            auVar50 = ZEXT3264(CONCAT428(uStack_1144,
                                         CONCAT424(fStack_1148,
                                                   CONCAT420(fStack_114c,
                                                             CONCAT416(fStack_1150,
                                                                       CONCAT412(fStack_1154,
                                                                                 CONCAT48(
                                                  fStack_1158,CONCAT44(fStack_115c,local_1160)))))))
                              );
            auVar32 = ZEXT3264(local_fc0);
            context = local_12f0;
            ray = local_12f8;
            lVar22 = local_12e8;
          }
          auVar36 = auVar32._0_32_;
          local_12e0 = local_12e0 + 1;
        } while (lVar22 != local_12e0);
      }
      auVar29 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),local_12c0,1);
      auVar29 = auVar36 & auVar29;
    } while ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar29 >> 0x7f,0) == '\0') &&
               (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar29 >> 0xbf,0) == '\0') &&
             (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar29[0x1f]);
    local_12c0 = vblendvps_avx(local_12c0,*(undefined1 (*) [32])(ray + 0x100),auVar36);
    auVar36 = vshufps_avx(local_12c0,local_12c0,0xb1);
    auVar36 = vmaxps_avx(local_12c0,auVar36);
    auVar29 = vshufpd_avx(auVar36,auVar36,5);
    auVar36 = vmaxps_avx(auVar36,auVar29);
    auVar6 = vmaxss_avx(auVar36._0_16_,auVar36._16_16_);
  } while( true );
}

Assistant:

static __forceinline vboolf8 operator ==(const vint8& a, const vint8& b) { return _mm256_castsi256_ps(_mm256_cmpeq_epi32(a, b)); }